

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O3

bool __thiscall flatbuffers::JavaGRPCGenerator::generate(JavaGRPCGenerator *this)

{
  ServiceDef *pSVar1;
  Namespace *this_00;
  SymbolTable<flatbuffers::ServiceDef> *pSVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  Parameters *in_R8;
  long lVar7;
  string filename;
  string output;
  Parameters p;
  FlatBufFile file;
  string local_100;
  File *local_e0;
  BaseGenerator *local_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  CommentHolder local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  undefined **local_50;
  Parser *local_48;
  string *local_40;
  undefined4 local_38;
  
  local_48 = (this->super_BaseGenerator).parser_;
  local_40 = (this->super_BaseGenerator).file_name_;
  local_50 = &PTR__CommentHolder_003ea388;
  local_38 = 2;
  local_90._vptr_CommentHolder = (_func_int **)&local_80;
  local_88 = 0;
  local_80 = 0;
  if ((int)((ulong)((long)(local_48->services_).vec.
                          super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_48->services_).vec.
                         super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    bVar3 = true;
  }
  else {
    lVar7 = 0;
    local_d8 = &this->super_BaseGenerator;
    do {
      pSVar2 = &local_48->services_;
      local_e0 = (File *)operator_new(0x10);
      pSVar1 = (pSVar2->vec).
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7];
      (local_e0->super_CommentHolder)._vptr_CommentHolder =
           (_func_int **)&PTR__CommentHolder_003ea210;
      local_e0[1].super_CommentHolder._vptr_CommentHolder = (_func_int **)pSVar1;
      pSVar1 = (local_d8->parser_->services_).vec.
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7];
      this_00 = (pSVar1->super_Definition).defined_namespace;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
      Namespace::GetFullyQualifiedName(&local_d0,this_00,&local_100,1000);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      grpc_java_generator::GenerateServiceSource_abi_cxx11_
                (&local_d0,(grpc_java_generator *)&local_50,local_e0,(Service *)&local_90,in_R8);
      BaseGenerator::NamespaceDir_abi_cxx11_
                (&local_70,local_d8,(pSVar1->super_Definition).defined_namespace,false);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,
                                  *(ulong *)&(pSVar1->super_Definition).name._M_dataplus);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_a0 = *plVar5;
        lStack_98 = plVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar5;
        local_b0 = (long *)*plVar4;
      }
      local_a8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_100.field_2._M_allocated_capacity = *psVar6;
        local_100.field_2._8_8_ = plVar4[3];
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar6;
        local_100._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_100._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar3 = SaveFile(local_100._M_dataplus._M_p,local_d0._M_dataplus._M_p,
                       local_d0._M_string_length,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      (*(local_e0->super_CommentHolder)._vptr_CommentHolder[1])();
      if (!bVar3) break;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)(local_48->services_).vec.
                                         super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_48->services_).vec.
                                        super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
    if (local_90._vptr_CommentHolder != (_func_int **)&local_80) {
      operator_delete(local_90._vptr_CommentHolder,CONCAT71(uStack_7f,local_80) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageJava);
    grpc_java_generator::Parameters p;
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_java_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "Grpc.java";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }